

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeNonProjectedTriLod
                (LodMode mode,IVec2 *dstSize,deInt32 srcSize,Vec3 *sq)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float dy;
  float dx;
  float duy;
  float dux;
  Vec3 *sq_local;
  deInt32 srcSize_local;
  IVec2 *dstSize_local;
  LodMode mode_local;
  
  fVar3 = tcu::Vector<float,_3>::z(sq);
  fVar4 = tcu::Vector<float,_3>::x(sq);
  fVar5 = tcu::Vector<float,_3>::y(sq);
  fVar6 = tcu::Vector<float,_3>::x(sq);
  iVar1 = tcu::Vector<int,_2>::x(dstSize);
  iVar2 = tcu::Vector<int,_2>::y(dstSize);
  fVar3 = computeLodFromDerivates
                    (mode,((fVar3 - fVar4) * (float)srcSize) / (float)iVar1,
                     ((fVar5 - fVar6) * (float)srcSize) / (float)iVar2);
  return fVar3;
}

Assistant:

static float computeNonProjectedTriLod (LodMode mode, const tcu::IVec2& dstSize, deInt32 srcSize, const tcu::Vec3& sq)
{
	float dux	= (sq.z() - sq.x()) * (float)srcSize;
	float duy	= (sq.y() - sq.x()) * (float)srcSize;
	float dx	= (float)dstSize.x();
	float dy	= (float)dstSize.y();

	return computeLodFromDerivates(mode, dux/dx, duy/dy);
}